

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O1

Function * __thiscall
wasm::anon_unknown_0::LegalizeJSInterface::getFunctionOrImport
          (LegalizeJSInterface *this,Module *module,Name name,Type params,Type results)

{
  bool bVar1;
  Function *pFVar2;
  char *pcVar3;
  Module *this_00;
  Function *pFVar4;
  pointer ppFVar5;
  Name name_00;
  Signature sig;
  Name name_01;
  undefined1 local_f8 [8];
  ImportInfo info;
  HeapType local_58;
  Type local_50;
  Module *local_48;
  Function *local_40;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> import;
  
  name_00.super_IString.str._M_str = name.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)module;
  local_40 = Module::getFunctionOrNull((Module *)this,name_00);
  if (local_40 == (Function *)0x0) {
    local_50.id = params.id;
    local_48 = (Module *)this;
    ImportInfo::ImportInfo((ImportInfo *)local_f8,(Module *)this);
    pFVar2 = (Function *)&ENV;
    for (ppFVar5 = (pointer)info.importedGlobals.
                            super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
        ppFVar5 !=
        info.importedFunctions.
        super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_start; ppFVar5 = ppFVar5 + 1) {
      pFVar4 = *ppFVar5;
      if (((pFVar4->super_Importable).module.super_IString.str._M_str == DAT_010d1118) &&
         ((pFVar4->super_Importable).base.super_IString.str._M_str ==
          (char *)name_00.super_IString.str._M_str)) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        pFVar4 = pFVar2;
      }
      if (!bVar1) goto LAB_00929323;
      pFVar2 = pFVar4;
    }
    pFVar4 = (Function *)0x0;
LAB_00929323:
    if (pFVar4 == (Function *)0x0) {
      sig.results.id = local_50.id;
      sig.params.id = name.super_IString.str._M_str;
      HeapType::HeapType(&local_58,sig);
      info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      name_01.super_IString.str._M_str = (char *)module;
      name_01.super_IString.str._M_len = (size_t)&local_38;
      Builder::makeFunction
                (name_01,name_00.super_IString.str._M_str,
                 (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58.id,
                 (Expression *)
                 &info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_00 = local_48;
      if (info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(info.importedTags.
                        super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        -(long)info.importedTags.
                               super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage);
      }
      pcVar3 = DAT_010d1118;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = ENV;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar3;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = (size_t)module;
      local_40 = local_38._M_head_impl;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str =
           (char *)name_00.super_IString.str._M_str;
      Module::addFunction(this_00,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                   *)&local_38);
      pFVar4 = local_40;
      if (local_38._M_head_impl != (Function *)0x0) {
        std::default_delete<wasm::Function>::operator()
                  ((default_delete<wasm::Function> *)&local_38,local_38._M_head_impl);
        pFVar4 = local_40;
      }
    }
    local_40 = pFVar4;
    if (info.importedMemories.super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(info.importedMemories.
                      super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)info.importedTags.
                            super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)info.importedMemories.
                            super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (info.importedTables.super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(info.importedTables.
                      super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)info.importedMemories.
                            super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)info.importedTables.
                            super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (info.importedFunctions.
        super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(info.importedFunctions.
                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)info.importedTables.
                            super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)info.importedFunctions.
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (info.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(info.importedGlobals.
                      super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)info.importedFunctions.
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)info.importedGlobals.
                            super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (info.wasm != (Module *)0x0) {
      operator_delete(info.wasm,
                      (long)info.importedGlobals.
                            super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)info.wasm);
    }
  }
  return local_40;
}

Assistant:

static Function*
  getFunctionOrImport(Module* module, Name name, Type params, Type results) {
    // First look for the function by name
    if (Function* f = module->getFunctionOrNull(name)) {
      return f;
    }
    // Then see if its already imported
    ImportInfo info(*module);
    if (Function* f = info.getImportedFunction(ENV, name)) {
      return f;
    }
    // Failing that create a new function import.
    auto import = Builder::makeFunction(name, Signature(params, results), {});
    import->module = ENV;
    import->base = name;
    auto* ret = import.get();
    module->addFunction(std::move(import));
    return ret;
  }